

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

bool __thiscall pbrt::Transform::SwapsHandedness(Transform *this)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float *pfVar4;
  undefined1 auVar5 [64];
  Float det;
  Float minor01;
  Float minor02;
  Float minor12;
  int in_stack_fffffffffffffeac;
  float i;
  undefined4 in_stack_fffffffffffffeb0;
  float fVar6;
  undefined4 in_stack_fffffffffffffeb4;
  float fVar7;
  float in_stack_fffffffffffffeb8;
  float d;
  float in_stack_fffffffffffffebc;
  float c;
  float in_stack_fffffffffffffec0;
  float b;
  float in_stack_fffffffffffffec4;
  float a;
  span<const_float> local_118;
  span<const_float> local_108;
  span<const_float> local_f8;
  span<const_float> local_e0;
  span<const_float> local_d0;
  span<const_float> local_c0;
  span<const_float> local_b0;
  float local_9c;
  span<const_float> local_98;
  span<const_float> local_88;
  span<const_float> local_78;
  span<const_float> local_68;
  float local_54;
  span<const_float> local_50;
  span<const_float> local_40;
  span<const_float> local_30;
  span<const_float> local_20;
  float local_c;
  undefined1 extraout_var [60];
  
  local_20 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        in_stack_fffffffffffffeac);
  pfVar4 = pstd::span<const_float>::operator[](&local_20,1);
  i = *pfVar4;
  local_30 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),(int)i);
  pfVar4 = pstd::span<const_float>::operator[](&local_30,2);
  fVar6 = *pfVar4;
  local_40 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffffeb4,fVar6),(int)i);
  pfVar4 = pstd::span<const_float>::operator[](&local_40,2);
  fVar7 = *pfVar4;
  local_50 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pstd::span<const_float>::operator[](&local_50,1);
  local_c = DifferenceOfProducts<float,float,float,float>
                      (in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc
                       ,in_stack_fffffffffffffeb8);
  local_68 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pfVar4 = pstd::span<const_float>::operator[](&local_68,0);
  d = *pfVar4;
  local_78 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pfVar4 = pstd::span<const_float>::operator[](&local_78,2);
  c = *pfVar4;
  local_88 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pfVar4 = pstd::span<const_float>::operator[](&local_88,2);
  b = *pfVar4;
  local_98 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pstd::span<const_float>::operator[](&local_98,0);
  local_54 = DifferenceOfProducts<float,float,float,float>(in_stack_fffffffffffffec4,b,c,d);
  local_b0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pfVar4 = pstd::span<const_float>::operator[](&local_b0,0);
  a = *pfVar4;
  local_c0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pstd::span<const_float>::operator[](&local_c0,1);
  local_d0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pstd::span<const_float>::operator[](&local_d0,1);
  local_e0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pstd::span<const_float>::operator[](&local_e0,0);
  local_9c = DifferenceOfProducts<float,float,float,float>(a,b,c,d);
  local_f8 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pfVar4 = pstd::span<const_float>::operator[](&local_f8,2);
  fVar3 = local_9c;
  fVar1 = *pfVar4;
  local_108 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pstd::span<const_float>::operator[](&local_108,0);
  local_118 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar7,fVar6),(int)i);
  pstd::span<const_float>::operator[](&local_118,1);
  auVar5._0_4_ = DifferenceOfProducts<float,float,float,float>(a,b,c,d);
  auVar5._4_60_ = extraout_var;
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar1),auVar5._0_16_);
  return auVar2._0_4_ < 0.0;
}

Assistant:

bool Transform::SwapsHandedness() const {
    Float minor12 = DifferenceOfProducts(m[1][1], m[2][2], m[1][2], m[2][1]);
    Float minor02 = DifferenceOfProducts(m[1][0], m[2][2], m[1][2], m[2][0]);
    Float minor01 = DifferenceOfProducts(m[1][0], m[2][1], m[1][1], m[2][0]);
    Float det =
        m[0][2] * minor01 + DifferenceOfProducts(m[0][0], minor12, m[0][1], minor02);
    return det < 0;
}